

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ir.c
# Opt level: O3

TRef lj_ir_tostr(jit_State *J,TRef tr)

{
  TRef TVar1;
  
  if ((tr & 0x1f000000) == 0x4000000) {
    return tr;
  }
  if ((tr >> 0x18 & 0x1e) - 0xe < 6) {
    (J->fold).ins.field_0.ot = 0x5b04;
    (J->fold).ins.field_0.op1 = (IRRef1)tr;
    *(ushort *)((long)&(J->fold).ins + 2) = (ushort)((tr & 0x1f000000) == 0xe000000);
    TVar1 = lj_opt_fold(J);
    return TVar1;
  }
  lj_trace_err(J,LJ_TRERR_BADTYPE);
}

Assistant:

TRef LJ_FASTCALL lj_ir_tostr(jit_State *J, TRef tr)
{
  if (!tref_isstr(tr)) {
    if (!tref_isnumber(tr))
      lj_trace_err(J, LJ_TRERR_BADTYPE);
    tr = emitir(IRT(IR_TOSTR, IRT_STR), tr,
		tref_isnum(tr) ? IRTOSTR_NUM : IRTOSTR_INT);
  }
  return tr;
}